

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileCheckpointWriter::WriteTable
          (SingleFileCheckpointWriter *this,TableCatalogEntry *table,Serializer *serializer)

{
  pointer this_00;
  pointer *__ptr;
  undefined1 local_28 [8];
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> table_lock;
  
  table_lock.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
  _M_t.super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)table;
  Serializer::WriteProperty<duckdb::TableCatalogEntry*>
            (serializer,100,"table",(TableCatalogEntry **)&table_lock);
  (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x10])
            (table);
  DataTable::GetCheckpointLock((DataTable *)&table_lock);
  GetTableDataWriter((SingleFileCheckpointWriter *)local_28,(TableCatalogEntry *)this);
  if (local_28 != (undefined1  [8])0x0) {
    this_00 = unique_ptr<duckdb::TableDataWriter,_std::default_delete<duckdb::TableDataWriter>,_true>
              ::operator->((unique_ptr<duckdb::TableDataWriter,_std::default_delete<duckdb::TableDataWriter>,_true>
                            *)local_28);
    TableDataWriter::WriteTableData(this_00,serializer);
    if (local_28 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_28)[1])();
    }
  }
  PartialBlockManager::FlushPartialBlocks(&this->partial_block_manager);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr(&table_lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
             );
  return;
}

Assistant:

void SingleFileCheckpointWriter::WriteTable(TableCatalogEntry &table, Serializer &serializer) {
	// Write the table metadata
	serializer.WriteProperty(100, "table", &table);

	// Write the table data
	auto table_lock = table.GetStorage().GetCheckpointLock();
	if (auto writer = GetTableDataWriter(table)) {
		writer->WriteTableData(serializer);
	}
	// flush any partial blocks BEFORE releasing the table lock
	// flushing partial blocks updates where data lives and is not thread-safe
	partial_block_manager.FlushPartialBlocks();
}